

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O1

void __thiscall
t_java_generator::generate_java_struct_field_by_id
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  size_type __dnew;
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  local_38 = 0x26;
  local_58 = local_48;
  local_58 = (long *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_48[0] = local_38;
  builtin_strncpy((char *)((long)local_58 + 0x1e),"Nullable",8);
  local_58[2] = 0x746f6e6e612e7466;
  local_58[3] = 0x754e2e6e6f697461;
  *local_58 = 0x6170612e67726f40;
  local_58[1] = 0x697268742e656863;
  local_50 = local_38;
  *(char *)((long)local_58 + local_38) = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_58,local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"public _Fields fieldForId(int fieldId) {",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"  return _Fields.findByThriftId(fieldId);",0x29);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar1 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_field_by_id(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << java_nullable_annotation() << endl;
  indent(out) << "public _Fields fieldForId(int fieldId) {" << endl;
  indent(out) << "  return _Fields.findByThriftId(fieldId);" << endl;
  indent(out) << "}" << endl << endl;
}